

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::on_disk_write_complete(torrent *this,storage_error *error,peer_request *p)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  piece_picker *ppVar4;
  alert_manager *paVar5;
  digest32<160L> local_a0;
  basic_endpoint<boost::asio::ip::tcp> local_8c;
  undefined1 local_70 [72];
  piece_block local_28;
  piece_block block_finished;
  peer_request *p_local;
  storage_error *error_local;
  torrent *this_local;
  
  block_finished = (piece_block)p;
  counters::inc_stats_counter(this->m_stats_counters,0xfc,(long)-p->length);
  if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1a & 1) == 0) {
    local_70._68_4_ = *(undefined4 *)block_finished;
    iVar1 = *(int *)((long)block_finished + 4);
    iVar3 = block_size(this);
    piece_block::piece_block(&local_28,(piece_index_t)local_70._68_4_,iVar1 / iVar3);
    bVar2 = storage_error::operator_cast_to_bool(error);
    if (bVar2) {
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)(local_70 + 0x20),"write");
      handle_disk_error(this,(string_view)local_70._32_16_,error,(peer_connection *)0x0,none);
    }
    else {
      bVar2 = has_picker(this);
      if (bVar2) {
        ppVar4 = picker(this);
        local_70._24_4_ = local_28.piece_index.m_val;
        local_70._28_4_ = local_28.block_index;
        bVar2 = piece_picker::is_finished(ppVar4,local_28);
        if (!bVar2) {
          ppVar4 = picker(this);
          local_70._16_4_ = local_28.piece_index.m_val;
          local_70._20_4_ = local_28.block_index;
          piece_picker::mark_as_finished(ppVar4,local_28,(torrent_peer *)0x0);
          maybe_done_flushing(this);
          paVar5 = alerts(this);
          bVar2 = alert_manager::should_post<libtorrent::block_finished_alert>(paVar5);
          if (bVar2) {
            paVar5 = alerts(this);
            get_handle((torrent *)local_70);
            boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint(&local_8c);
            digest32<160L>::digest32(&local_a0);
            alert_manager::
            emplace_alert<libtorrent::block_finished_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,libtorrent::digest32<160l>,int_const&,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&>
                      (paVar5,(torrent_handle *)local_70,&local_8c,&local_a0,&local_28.block_index,
                       &local_28.piece_index);
            torrent_handle::~torrent_handle((torrent_handle *)local_70);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void torrent::on_disk_write_complete(storage_error const& error
		, peer_request const& p) try
	{
		TORRENT_ASSERT(is_single_thread());

		m_stats_counters.inc_stats_counter(counters::queued_write_bytes, -p.length);

//		std::fprintf(stderr, "torrent::on_disk_write_complete ret:%d piece:%d block:%d\n"
//			, j->ret, j->piece, j->offset/0x4000);

		INVARIANT_CHECK;
		if (m_abort) return;
		piece_block const block_finished(p.piece, p.start / block_size());

		if (error)
		{
			handle_disk_error("write", error);
			return;
		}

		if (!has_picker()) return;

		// if we already have this block, just ignore it.
		// this can happen if the same block is passed in through
		// add_piece() multiple times
		if (picker().is_finished(block_finished)) return;

		picker().mark_as_finished(block_finished, nullptr);
		maybe_done_flushing();

		if (alerts().should_post<block_finished_alert>())
		{
			alerts().emplace_alert<block_finished_alert>(get_handle(),
				tcp::endpoint(), peer_id(), block_finished.block_index
				, block_finished.piece_index);
		}
	}
	catch (...) { handle_exception(); }